

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::PerformOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  uint32_t uVar1;
  Type *pTVar2;
  uint32_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvVar5;
  const_reference ppCVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Constant *c;
  Instruction *this;
  long lVar7;
  Constant *merged_const;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  long *local_a0;
  VectorConstant *input2_vector;
  Constant *input2_comp;
  long *local_78;
  VectorConstant *input1_vector;
  Constant *input1_comp;
  uint32_t id;
  uint32_t i;
  Type *ele_type;
  Vector *vector_type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  Type *type;
  Constant *input2_local;
  Constant *input1_local;
  Op opcode_local;
  ConstantManager *const_mgr_local;
  
  if (input1 == (Constant *)0x0 || input2 == (Constant *)0x0) {
    __assert_fail("input1 && input2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x288,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)analysis::Constant::type(input1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vector_type);
  ele_type = (Type *)(**(code **)(*(long *)words.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x70
                                 ))();
  if ((Vector *)ele_type == (Vector *)0x0) {
    lVar7 = (**(code **)(*(long *)words.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0x60))();
    if (lVar7 == 0) {
      lVar7 = (**(code **)(*(long *)words.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0x50))();
      if (lVar7 == 0) {
        __assert_fail("type->AsInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x2b3,
                      "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                     );
      }
      const_mgr_local._4_4_ = PerformIntegerOperation(const_mgr,opcode,input1,input2);
    }
    else {
      const_mgr_local._4_4_ = PerformFloatingPointOperation(const_mgr,opcode,input1,input2);
    }
  }
  else {
    _id = analysis::Vector::element_type((Vector *)ele_type);
    for (input1_comp._4_4_ = 0; uVar1 = input1_comp._4_4_,
        uVar3 = analysis::Vector::element_count((Vector *)ele_type), uVar1 != uVar3;
        input1_comp._4_4_ = input1_comp._4_4_ + 1) {
      input1_comp._0_4_ = 0;
      input1_vector = (VectorConstant *)0x0;
      iVar4 = (*input1->_vptr_Constant[0x13])();
      local_78 = (long *)CONCAT44(extraout_var,iVar4);
      if (local_78 == (long *)0x0) {
        iVar4 = (*input1->_vptr_Constant[0x16])();
        pTVar2 = _id;
        if (CONCAT44(extraout_var_00,iVar4) == 0) {
          __assert_fail("input1->AsNullConstant()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x295,
                        "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                       );
        }
        memset(&input2_comp,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&input2_comp);
        input1_vector =
             (VectorConstant *)
             analysis::ConstantManager::GetConstant
                       (const_mgr,pTVar2,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&input2_comp);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&input2_comp);
      }
      else {
        pvVar5 = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)(**(code **)(*local_78 + 0xc0))();
        ppCVar6 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](pvVar5,(ulong)input1_comp._4_4_);
        input1_vector = (VectorConstant *)*ppCVar6;
      }
      input2_vector = (VectorConstant *)0x0;
      iVar4 = (*input2->_vptr_Constant[0x13])();
      local_a0 = (long *)CONCAT44(extraout_var_01,iVar4);
      if (local_a0 == (long *)0x0) {
        iVar4 = (*input2->_vptr_Constant[0x16])();
        pTVar2 = _id;
        if (CONCAT44(extraout_var_02,iVar4) == 0) {
          __assert_fail("input2->AsNullConstant()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x29e,
                        "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                       );
        }
        memset(&local_b8,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8);
        input2_vector =
             (VectorConstant *)analysis::ConstantManager::GetConstant(const_mgr,pTVar2,&local_b8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
      }
      else {
        pvVar5 = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)(**(code **)(*local_a0 + 0xc0))();
        ppCVar6 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](pvVar5,(ulong)input1_comp._4_4_);
        input2_vector = (VectorConstant *)*ppCVar6;
      }
      iVar4 = (*_id->_vptr_Type[0xc])();
      if (CONCAT44(extraout_var_03,iVar4) == 0) {
        iVar4 = (*_id->_vptr_Type[10])();
        if (CONCAT44(extraout_var_04,iVar4) == 0) {
          __assert_fail("ele_type->AsInteger()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x2a6,
                        "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                       );
        }
        input1_comp._0_4_ =
             PerformIntegerOperation
                       (const_mgr,opcode,(Constant *)input1_vector,(Constant *)input2_vector);
      }
      else {
        input1_comp._0_4_ =
             PerformFloatingPointOperation
                       (const_mgr,opcode,(Constant *)input1_vector,(Constant *)input2_vector);
      }
      if ((uint32_t)input1_comp == 0) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037df6f;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vector_type,
                 (value_type_conflict2 *)&input1_comp);
    }
    c = analysis::ConstantManager::GetConstant
                  (const_mgr,
                   (Type *)words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vector_type);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
    const_mgr_local._4_4_ = Instruction::result_id(this);
  }
LAB_0037df6f:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vector_type);
  return const_mgr_local._4_4_;
}

Assistant:

uint32_t PerformOperation(analysis::ConstantManager* const_mgr, spv::Op opcode,
                          const analysis::Constant* input1,
                          const analysis::Constant* input2) {
  assert(input1 && input2);
  const analysis::Type* type = input1->type();
  std::vector<uint32_t> words;
  if (const analysis::Vector* vector_type = type->AsVector()) {
    const analysis::Type* ele_type = vector_type->element_type();
    for (uint32_t i = 0; i != vector_type->element_count(); ++i) {
      uint32_t id = 0;

      const analysis::Constant* input1_comp = nullptr;
      if (const analysis::VectorConstant* input1_vector =
              input1->AsVectorConstant()) {
        input1_comp = input1_vector->GetComponents()[i];
      } else {
        assert(input1->AsNullConstant());
        input1_comp = const_mgr->GetConstant(ele_type, {});
      }

      const analysis::Constant* input2_comp = nullptr;
      if (const analysis::VectorConstant* input2_vector =
              input2->AsVectorConstant()) {
        input2_comp = input2_vector->GetComponents()[i];
      } else {
        assert(input2->AsNullConstant());
        input2_comp = const_mgr->GetConstant(ele_type, {});
      }

      if (ele_type->AsFloat()) {
        id = PerformFloatingPointOperation(const_mgr, opcode, input1_comp,
                                           input2_comp);
      } else {
        assert(ele_type->AsInteger());
        id = PerformIntegerOperation(const_mgr, opcode, input1_comp,
                                     input2_comp);
      }
      if (id == 0) return 0;
      words.push_back(id);
    }
    const analysis::Constant* merged_const =
        const_mgr->GetConstant(type, words);
    return const_mgr->GetDefiningInstruction(merged_const)->result_id();
  } else if (type->AsFloat()) {
    return PerformFloatingPointOperation(const_mgr, opcode, input1, input2);
  } else {
    assert(type->AsInteger());
    return PerformIntegerOperation(const_mgr, opcode, input1, input2);
  }
}